

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLimit::SetMax(ChLinkLimit *this,double val)

{
  double dVar1;
  
  this->m_max = val;
  if (val < this->m_min) {
    this->m_min = val;
  }
  dVar1 = this->m_min;
  if (val - this->m_maxCushion < dVar1) {
    this->m_maxCushion = val - dVar1;
  }
  if (val - this->m_maxCushion < dVar1 + this->m_minCushion) {
    this->m_minCushion = (val - dVar1) - this->m_maxCushion;
  }
  (this->constr_upper).super_ChConstraintTwo.super_ChConstraint.active = true;
  return;
}

Assistant:

void ChLinkLimit::SetMax(double val) {
    m_max = val;
    if (m_max < m_min)
        m_min = m_max;
    if (m_max - m_maxCushion < m_min)
        m_maxCushion = m_max - m_min;
    if (m_max - m_maxCushion < m_min + m_minCushion)
        m_minCushion = m_max - m_min - m_maxCushion;
    constr_upper.SetActive(true);
}